

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::GetUtf8Suffix_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field,Options *options)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = 0;
  if ((*(int *)(*(long *)(this + 0x28) + 0x3c) != 3) &&
     (iVar1 = *(int *)(field + 0x24), 1 < iVar1 - 1U)) {
    iVar1 = (*(int *)(*(long *)(*(long *)(this + 0x28) + 0x88) + 0xa4) == 3) + 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar1 == 1) {
    pcVar3 = "UTF8Verify";
    pcVar2 = "";
  }
  else if (iVar1 == 0) {
    pcVar3 = "UTF8";
    pcVar2 = "";
  }
  else {
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GetUtf8Suffix(const FieldDescriptor* field,
                          const Options& options) {
  switch (GetUtf8CheckMode(field, options)) {
    case STRICT:
      return "UTF8";
    case VERIFY:
      return "UTF8Verify";
    case NONE:
    default:  // Some build configs warn on missing return without default.
      return "";
  }
}